

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_ldd.c
# Opt level: O0

void lddmc_nodecount_levels_mark(MDD mdd,size_t *variables)

{
  uint8_t uVar1;
  mddnode_t n_00;
  uint64_t uVar2;
  mddnode_t n;
  size_t *variables_local;
  MDD mdd_local;
  
  if (1 < mdd) {
    n_00 = LDD_GETNODE(mdd);
    uVar1 = mddnode_getmark(n_00);
    if (uVar1 == '\0') {
      mddnode_setmark(n_00,'\x01');
      *variables = *variables + 1;
      uVar2 = mddnode_getright(n_00);
      lddmc_nodecount_levels_mark(uVar2,variables);
      uVar2 = mddnode_getdown(n_00);
      lddmc_nodecount_levels_mark(uVar2,variables + 1);
    }
  }
  return;
}

Assistant:

static void
lddmc_nodecount_levels_mark(MDD mdd, size_t *variables)
{
    if (mdd <= lddmc_true) return;
    mddnode_t n = LDD_GETNODE(mdd);
    if (!mddnode_getmark(n)) {
        mddnode_setmark(n, 1);
        (*variables) += 1;
        lddmc_nodecount_levels_mark(mddnode_getright(n), variables);
        lddmc_nodecount_levels_mark(mddnode_getdown(n), variables+1);
    }
}